

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

ClassDecl * __thiscall SQCompilation::SQParser::ClassExp(SQParser *this,Expr *key)

{
  SQParser *args;
  SQParser *pSVar1;
  ClassDecl *pCVar2;
  SQParser *in_RDI;
  SQExpressionContext in_stack_0000003c;
  SQParser *in_stack_00000040;
  ClassDecl *d;
  Expr *baseExpr;
  SQInteger c;
  SQInteger l;
  NestingChecker nc;
  SQInteger in_stack_000000c8;
  SQInteger in_stack_000000d0;
  TableDecl *in_stack_000000d8;
  SQParser *in_stack_000000e0;
  SQParser *in_stack_ffffffffffffff68;
  SQParser *in_stack_ffffffffffffff70;
  SQParser *in_stack_ffffffffffffff80;
  Expr *in_stack_ffffffffffffff88;
  Expr *in_stack_ffffffffffffff90;
  Expr *tok;
  NestingChecker local_20 [2];
  
  NestingChecker::NestingChecker
            ((NestingChecker *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  line(in_RDI);
  args = (SQParser *)column(in_RDI);
  tok = (Expr *)0x0;
  pSVar1 = args;
  if (in_RDI->_token == 0x134) {
    Lex(in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff90 = Expression(in_stack_00000040,in_stack_0000003c);
    tok = in_stack_ffffffffffffff90;
  }
  else if (in_RDI->_token == 0x28) {
    Lex(in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff88 = Expression(in_stack_00000040,in_stack_0000003c);
    tok = in_stack_ffffffffffffff88;
    Expect(pSVar1,(SQInteger)in_stack_ffffffffffffff88);
  }
  checkBraceIndentationStyle(in_stack_ffffffffffffff70);
  Expect(pSVar1,(SQInteger)tok);
  pSVar1 = (SQParser *)arena(in_RDI);
  pCVar2 = newNode<SQCompilation::ClassDecl,Arena*,SQCompilation::Expr*,SQCompilation::Expr*>
                     (in_RDI,(Arena *)args,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ParseTableOrClass(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  pCVar2 = setCoordinates<SQCompilation::ClassDecl>
                     (pSVar1,pCVar2,(SQInteger)in_stack_ffffffffffffff70,
                      (SQInteger)in_stack_ffffffffffffff68);
  NestingChecker::~NestingChecker(local_20);
  return pCVar2;
}

Assistant:

ClassDecl* SQParser::ClassExp(Expr *key)
{
    NestingChecker nc(this);
    SQInteger l = line(), c = column();
    Expr *baseExpr = NULL;
    if(_token == TK_EXTENDS) {
        Lex();
        baseExpr = Expression(SQE_RVALUE);
    }
    else if (_token == _SC('(')) {
      Lex();
      baseExpr = Expression(SQE_RVALUE);
      Expect(_SC(')'));
    }
    checkBraceIndentationStyle();
    Expect(_SC('{'));
    ClassDecl *d = newNode<ClassDecl>(arena(), key, baseExpr);
    ParseTableOrClass(d, _SC(';'),_SC('}'));
    return setCoordinates(d, l, c);
}